

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shared.h
# Opt level: O3

void readData<double>(Serializer *serializer,DataFieldInfo *info,Savepoint *savepoint,double **data)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  pointer pcVar5;
  int iVar6;
  double *pdVar7;
  uint uVar8;
  uint uVar9;
  ulong uVar10;
  string fieldName;
  
  uVar1 = info->bytesPerElement_;
  iVar2 = info->jSize_;
  iVar3 = info->kSize_;
  iVar4 = info->lSize_;
  iVar6 = info->iSize_;
  fieldName._M_dataplus._M_p = (pointer)&fieldName.field_2;
  pcVar5 = (info->name_)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&fieldName,pcVar5,pcVar5 + (info->name_)._M_string_length);
  iVar6 = iVar3 * iVar4 * iVar6 * iVar2;
  uVar10 = 0xffffffffffffffff;
  if (-1 < iVar6) {
    uVar10 = (long)iVar6 * 8;
  }
  pdVar7 = (double *)operator_new__(uVar10);
  uVar8 = iVar4 * uVar1;
  uVar9 = iVar3 * uVar8;
  *data = pdVar7;
  (*serializer->_vptr_Serializer[3])
            (serializer,&fieldName,savepoint,pdVar7,(ulong)(iVar2 * uVar9),(ulong)uVar9,(ulong)uVar8
             ,(ulong)uVar1,0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)fieldName._M_dataplus._M_p != &fieldName.field_2) {
    operator_delete(fieldName._M_dataplus._M_p);
  }
  return;
}

Assistant:

void readData(const ser::Serializer& serializer, const ser::DataFieldInfo& info, const ser::Savepoint& savepoint, T*& data)
{
	int iSize = info.iSize();
	int jSize = info.jSize();
	int kSize = info.kSize();
	int lSize = info.lSize();
	int fieldLength = info.bytesPerElement();
	std::string fieldName = info.name();

	int lStride = fieldLength;
	int kStride = lSize * lStride;
	int jStride = kSize * kStride;
	int iStride = jSize * jStride;

	data = new T[iSize * jSize * kSize * lSize];
	serializer.ReadField(fieldName, savepoint, data, iStride, jStride, kStride, lStride);
}